

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::WriteDirectoryInformationFile(cmLocalUnixMakefileGenerator3 *this)

{
  byte bVar1;
  bool bVar2;
  string *psVar3;
  ostream *poVar4;
  undefined1 local_298 [8];
  cmGeneratedFileStream infoFileStream;
  string infoFileName;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[44]>
            ((string *)&infoFileStream.field_0x260,psVar3,
             (char (*) [44])"/CMakeFiles/CMakeDirectoryInformation.cmake");
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_298,(string *)&infoFileStream.field_0x260,false,None);
  bVar1 = std::ios::operator!((ios *)(local_298 + (long)*(_func_int **)((long)local_298 + -0x18)));
  if ((bVar1 & 1) == 0) {
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_298,true);
    WriteDisclaimer(this,(ostream *)local_298);
    poVar4 = std::operator<<((ostream *)local_298,"# Relative path conversion top directories.\n");
    poVar4 = std::operator<<(poVar4,"set(CMAKE_RELATIVE_PATH_TOP_SOURCE \"");
    psVar3 = cmOutputConverter::GetRelativePathTopSource_abi_cxx11_((cmOutputConverter *)this);
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    poVar4 = std::operator<<(poVar4,"\")\n");
    poVar4 = std::operator<<(poVar4,"set(CMAKE_RELATIVE_PATH_TOP_BINARY \"");
    psVar3 = cmOutputConverter::GetRelativePathTopBinary_abi_cxx11_((cmOutputConverter *)this);
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    poVar4 = std::operator<<(poVar4,"\")\n");
    std::operator<<(poVar4,"\n");
    bVar2 = cmSystemTools::GetForceUnixPaths();
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)local_298,"# Force unix paths in dependencies.\n");
      poVar4 = std::operator<<(poVar4,"set(CMAKE_FORCE_UNIX_PATHS 1)\n");
      std::operator<<(poVar4,"\n");
    }
    poVar4 = std::operator<<((ostream *)local_298,"\n");
    poVar4 = std::operator<<(poVar4,"# The C and CXX include file regular expressions for ");
    std::operator<<(poVar4,"this directory.\n");
    std::operator<<((ostream *)local_298,"set(CMAKE_C_INCLUDE_REGEX_SCAN ");
    psVar3 = cmMakefile::GetIncludeRegularExpression_abi_cxx11_
                       ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile);
    WriteCMakeArgument((ostream *)local_298,psVar3);
    std::operator<<((ostream *)local_298,")\n");
    std::operator<<((ostream *)local_298,"set(CMAKE_C_INCLUDE_REGEX_COMPLAIN ");
    psVar3 = cmMakefile::GetComplainRegularExpression_abi_cxx11_
                       ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile);
    WriteCMakeArgument((ostream *)local_298,psVar3);
    std::operator<<((ostream *)local_298,")\n");
    std::operator<<((ostream *)local_298,
                    "set(CMAKE_CXX_INCLUDE_REGEX_SCAN ${CMAKE_C_INCLUDE_REGEX_SCAN})\n");
    std::operator<<((ostream *)local_298,
                    "set(CMAKE_CXX_INCLUDE_REGEX_COMPLAIN ${CMAKE_C_INCLUDE_REGEX_COMPLAIN})\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  std::__cxx11::string::~string((string *)&infoFileStream.field_0x260);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteDirectoryInformationFile()
{
  std::string infoFileName =
    cmStrCat(this->GetCurrentBinaryDirectory(),
             "/CMakeFiles/CMakeDirectoryInformation.cmake");

  // Open the output file.
  cmGeneratedFileStream infoFileStream(infoFileName);
  if (!infoFileStream) {
    return;
  }

  infoFileStream.SetCopyIfDifferent(true);
  // Write the do not edit header.
  this->WriteDisclaimer(infoFileStream);

  // Setup relative path conversion tops.
  /* clang-format off */
  infoFileStream
    << "# Relative path conversion top directories.\n"
    << "set(CMAKE_RELATIVE_PATH_TOP_SOURCE \""
    << this->GetRelativePathTopSource() << "\")\n"
    << "set(CMAKE_RELATIVE_PATH_TOP_BINARY \""
    << this->GetRelativePathTopBinary() << "\")\n"
    << "\n";
  /* clang-format on */

  // Tell the dependency scanner to use unix paths if necessary.
  if (cmSystemTools::GetForceUnixPaths()) {
    /* clang-format off */
    infoFileStream
      << "# Force unix paths in dependencies.\n"
      << "set(CMAKE_FORCE_UNIX_PATHS 1)\n"
      << "\n";
    /* clang-format on */
  }

  // Store the include regular expressions for this directory.
  infoFileStream << "\n"
                 << "# The C and CXX include file regular expressions for "
                 << "this directory.\n";
  infoFileStream << "set(CMAKE_C_INCLUDE_REGEX_SCAN ";
  cmLocalUnixMakefileGenerator3::WriteCMakeArgument(
    infoFileStream, this->Makefile->GetIncludeRegularExpression());
  infoFileStream << ")\n";
  infoFileStream << "set(CMAKE_C_INCLUDE_REGEX_COMPLAIN ";
  cmLocalUnixMakefileGenerator3::WriteCMakeArgument(
    infoFileStream, this->Makefile->GetComplainRegularExpression());
  infoFileStream << ")\n";
  infoFileStream
    << "set(CMAKE_CXX_INCLUDE_REGEX_SCAN ${CMAKE_C_INCLUDE_REGEX_SCAN})\n";
  infoFileStream << "set(CMAKE_CXX_INCLUDE_REGEX_COMPLAIN "
                    "${CMAKE_C_INCLUDE_REGEX_COMPLAIN})\n";
}